

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
asl::Array<asl::Array<asl::Var>_>::Array
          (Array<asl::Array<asl::Var>_> *this,Array<asl::Var> *p,int n)

{
  int local_20;
  int i;
  int n_local;
  Array<asl::Var> *p_local;
  Array<asl::Array<asl::Var>_> *this_local;
  
  alloc(this,n);
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    Array<asl::Var>::operator=(this->_a + local_20,p + local_20);
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }